

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

void __thiscall
embree::barrier_sys_regression_test::barrier_sys_regression_test(barrier_sys_regression_test *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff98;
  __integral_type __i;
  RegressionTest *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc8;
  BarrierSys *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,"barrier_sys_regression_test",(allocator *)&stack0xffffffffffffffd7);
  RegressionTest::RegressionTest(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *in_RDI = &PTR_run_00600e38;
  BarrierSys::BarrierSys(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __i = 0;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_stack_ffffffffffffffa0,0);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_stack_ffffffffffffffa0,__i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x48a7ed);
  registerRegressionTest((RegressionTest *)0x48a7f7);
  return;
}

Assistant:

barrier_sys_regression_test() 
      : RegressionTest("barrier_sys_regression_test"), threadID(0), numFailed(0)
    {
      registerRegressionTest(this);
    }